

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O3

void __thiscall FIX50::Message::Message(Message *this,MsgType *msgtype)

{
  long *local_a8;
  long local_a0;
  long local_98 [2];
  undefined1 local_88 [16];
  _Alloc_hider local_78;
  char local_68 [16];
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  field_metrics local_38;
  
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"FIXT.1.1","");
  local_88._0_8_ = &PTR__FieldBase_00320f80;
  local_88._8_4_ = 8;
  local_78._M_p = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_a8,local_a0 + (long)local_a8);
  local_50 = 0;
  local_48._M_local_buf[0] = '\0';
  local_38.m_length = 0;
  local_38.m_checksum = 0;
  local_88._0_8_ = &PTR__FieldBase_00325970;
  local_58._M_p = (pointer)&local_48;
  FIX::Message::Message(&this->super_Message,(BeginString *)local_88,msgtype);
  FIX::FieldBase::~FieldBase((FieldBase *)local_88);
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  *(undefined ***)this = &PTR__Message_0032adf0;
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"7","");
  local_88._0_8_ = &PTR__FieldBase_00320f80;
  local_88._8_4_ = 0x468;
  local_78._M_p = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_a8,local_a0 + (long)local_a8);
  local_50 = 0;
  local_48._M_local_buf[0] = '\0';
  local_38.m_length = 0;
  local_38.m_checksum = 0;
  local_88._0_8_ = &PTR__FieldBase_00328ff8;
  local_58._M_p = (pointer)&local_48;
  FIX::FieldMap::setField((FieldMap *)&this->field_0x70,(FieldBase *)local_88,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_88);
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  return;
}

Assistant:

Message( const FIX::MsgType& msgtype )
    : FIX::Message(
      FIX::BeginString("FIXT.1.1"), msgtype )
     { getHeader().setField( FIX::ApplVerID("7") ); }